

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTS_misc.c
# Opt level: O1

size_t HTS_ftell(HTS_File *fp)

{
  fpos_t pos;
  fpos_t local_18;
  
  if (fp != (HTS_File *)0x0) {
    if (fp->type == '\x01') {
      local_18.__pos = *(size_t *)((long)fp->pointer + 0x10);
    }
    else if (fp->type == '\0') {
      fgetpos((FILE *)fp->pointer,&local_18);
    }
    else {
      HTS_ftell_cold_1();
      local_18.__pos = 0;
    }
    return local_18.__pos;
  }
  return 0;
}

Assistant:

size_t HTS_ftell(HTS_File * fp)
{
   if (fp == NULL) {
      return 0;
   } else if (fp->type == HTS_FILE) {
      fpos_t pos;
      fgetpos((FILE *) fp->pointer, &pos);
#if defined(_WIN32) || defined(__CYGWIN__) || defined(__APPLE__) || defined(__ANDROID__)
      return (size_t) pos;
#else
      return (size_t) pos.__pos;
#endif                          /* _WIN32 || __CYGWIN__ || __APPLE__ || __ANDROID__ */
   } else if (fp->type == HTS_DATA) {
      HTS_Data *d = (HTS_Data *) fp->pointer;
      return d->index;
   }
   HTS_error(0, "HTS_ftell: Unknown file type.\n");
   return 0;
}